

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O1

void play_ambient_sound(void)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  wchar_t t;
  
  sVar1 = player->depth;
  if (sVar1 == 0) {
    uVar2 = z_info->day_length;
    lVar3 = (long)turn % (long)((ulong)((uint)uVar2 + (uint)uVar2) * 5);
    sound((SBORROW8(lVar3,(ulong)uVar2 * 5) == (long)(lVar3 + (ulong)uVar2 * -5) < 0) + 0x83);
    return;
  }
  t = L'\x85';
  if (((0x14 < sVar1) && (t = L'\x86', 0x28 < sVar1)) && (t = L'\x87', 0x3c < sVar1)) {
    sound(sVar1 < 0x51 ^ 0x89);
    return;
  }
  if ((player->opts).opt[2] == true) {
    event_signal_message(EVENT_SOUND,t,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void play_ambient_sound(void)
{
	if (player->depth == 0) {
		if (is_daytime())
			sound(MSG_AMBIENT_DAY);
		else 
			sound(MSG_AMBIENT_NITE);
	} else if (player->depth <= 20) {
		sound(MSG_AMBIENT_DNG1);
	} else if (player->depth <= 40) {
		sound(MSG_AMBIENT_DNG2);
	} else if (player->depth <= 60) {
		sound(MSG_AMBIENT_DNG3);
	} else if (player->depth <= 80) {
		sound(MSG_AMBIENT_DNG4);
	} else {
		sound(MSG_AMBIENT_DNG5);
	}
}